

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

Vec_Int_t * Abc_GraphGrid(int n)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_40;
  
  iVar3 = n + -1;
  p = Vec_IntAlloc(n * iVar3 * 4);
  local_40 = 0;
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  iVar2 = 0;
  if (0 < n) {
    iVar2 = n;
  }
  iVar7 = 1;
  iVar4 = 0;
  while( true ) {
    iVar5 = iVar1;
    iVar6 = iVar7;
    if (iVar4 == iVar2) {
      return p;
    }
    while (iVar5 != 0) {
      Vec_IntPushTwo(p,iVar6 + -1,iVar6);
      iVar5 = iVar5 + -1;
      iVar6 = iVar6 + 1;
    }
    iVar5 = local_40;
    iVar6 = n;
    if (iVar4 == iVar3) break;
    while (iVar6 != 0) {
      Vec_IntPushTwo(p,iVar5,n + iVar5);
      iVar5 = iVar5 + 1;
      iVar6 = iVar6 + -1;
    }
    iVar4 = iVar4 + 1;
    iVar7 = iVar7 + n;
    local_40 = local_40 + n;
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_GraphGrid( int n )
{
    Vec_Int_t * vEdges = Vec_IntAlloc( 4*n*(n-1) ); // two nodes per edge
    int i, k;
    for ( i = 0; i < n; i++ )
    {
        for ( k = 0; k < n-1; k++ )
            Vec_IntPushTwo( vEdges, i*n+k, i*n+k+1 );
        if ( i == n-1 ) break;
        for ( k = 0; k < n; k++ )
            Vec_IntPushTwo( vEdges, i*n+k, i*n+k+n );
    }
    //Vec_IntPrint( vEdges );
    return vEdges;
}